

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions::
TabulatedFunctions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (TabulatedFunctions *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_00000084;
  int in_stack_ffffffffffffff70;
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>
  local_88;
  
  readInterpolationSequenceRecord<njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions::ScatteringFunction,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_88,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_00000084,MAT),MF,MT,
             in_stack_ffffffffffffff70);
  *(_Head_base<5UL,_long,_false> *)this =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  *(long *)(this + 8) =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  *(long *)(this + 0x10) =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  *(long *)(this + 0x18) =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  *(double *)(this + 0x20) =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  *(double *)(this + 0x28) =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  *(pointer *)(this + 0x30) =
       local_88.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x38) =
       local_88.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x40) =
       local_88.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  *(pointer *)(this + 0x48) =
       local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x50) =
       local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x58) =
       local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  *(pointer *)(this + 0x60) =
       local_88.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x68) =
       local_88.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x70) =
       local_88.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
  ::~vector(&local_88.sequence_);
  if (local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_88.interpolation_.super_InterpolationBase.
                                   interpolationSchemeIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_88.interpolation_.super_InterpolationBase.
                                   interpolationSchemeIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_88.interpolation_.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_88.interpolation_.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_88.interpolation_.super_InterpolationBase.boundaryIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_88.interpolation_.super_InterpolationBase.boundaryIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TabulatedFunctions( Iterator& begin,
                    const Iterator& end,
                    long& lineNumber,
                    int MAT,
                    int MF,
                    int MT )
  try : TabulatedFunctions(
          ENDFtk::readInterpolationSequenceRecord< ScatteringFunction >(
              begin, end, lineNumber, MAT, MF, MT ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing tabulated thermal "
               "scattering law" );
    throw;
  }